

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O0

void __thiscall QThreadPool::QThreadPool(QThreadPool *this,QObject *parent)

{
  long lVar1;
  QThreadPoolPrivate *context;
  QObject *in_RDI;
  long in_FS_OFFSET;
  offset_in_QObject_to_subr in_stack_00000010;
  ConnectionType in_stack_00000030;
  QThreadPoolPrivate *d;
  Connection *in_stack_ffffffffffffff90;
  QObject *parent_00;
  QThreadPoolPrivate *in_stack_ffffffffffffffe8;
  Object *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  parent_00 = in_RDI;
  operator_new(0x110);
  QThreadPoolPrivate::QThreadPoolPrivate(in_stack_ffffffffffffffe8);
  QObject::QObject(in_stack_fffffffffffffff0,&in_stack_ffffffffffffffe8->super_QObjectPrivate,
                   parent_00);
  in_RDI->_vptr_QObject = (_func_int **)&PTR_metaObject_00bea508;
  context = d_func((QThreadPool *)0x6cb992);
  QObject::
  connect<void(QObject::*)(QString_const&,QObject::QPrivateSignal),QThreadPool::QThreadPool(QObject*)::__0>
            (in_stack_fffffffffffffff0,in_stack_00000010,(ContextType *)context,
             (anon_class_8_1_54a39804_for_o *)parent_00,in_stack_00000030);
  QMetaObject::Connection::~Connection(in_stack_ffffffffffffff90);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QThreadPool::QThreadPool(QObject *parent)
    : QObject(*new QThreadPoolPrivate, parent)
{
    Q_D(QThreadPool);
    connect(this, &QObject::objectNameChanged, this, [d](const QString &newName) {
        // We keep a copy of the name under our own lock, so we can access it thread-safely.
        QMutexLocker locker(&d->mutex);
        d->objectName = newName;
    });
}